

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

int ptls_asn1_validation(uint8_t *bytes,size_t length,ptls_minicrypto_log_ctx_t *log_ctx)

{
  ptls_minicrypto_log_ctx_t *ppVar1;
  size_t decoded;
  ptls_minicrypto_log_ctx_t *ppStack_20;
  int decode_error;
  ptls_minicrypto_log_ctx_t *log_ctx_local;
  size_t length_local;
  uint8_t *bytes_local;
  
  decoded._4_4_ = 0;
  ppStack_20 = log_ctx;
  log_ctx_local = (ptls_minicrypto_log_ctx_t *)length;
  length_local = (size_t)bytes;
  ppVar1 = (ptls_minicrypto_log_ctx_t *)
           ptls_asn1_validation_recursive(bytes,length,(int *)((long)&decoded + 4),0,log_ctx);
  if (((decoded._4_4_ == 0) && (ppVar1 < log_ctx_local)) &&
     (decoded._4_4_ = 0x238, ppStack_20 != (ptls_minicrypto_log_ctx_t *)0x0)) {
    (*ppStack_20->fn)(ppStack_20->ctx,"Type too short, %d bytes only out of %d\n",
                      (ulong)ppVar1 & 0xffffffff,(ulong)log_ctx_local & 0xffffffff);
  }
  return decoded._4_4_;
}

Assistant:

int ptls_asn1_validation(const uint8_t *bytes, size_t length, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int decode_error = 0;
    size_t decoded = ptls_asn1_validation_recursive(bytes, length, &decode_error, 0, log_ctx);

    if (decode_error == 0 && decoded < length) {
        decode_error = PTLS_ERROR_BER_ELEMENT_TOO_SHORT;
        if (log_ctx != NULL) {
            log_ctx->fn(log_ctx->ctx, "Type too short, %d bytes only out of %d\n", (int)decoded, (int)length);
        }
    }

    return decode_error;
}